

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O2

size_t crnd::crnd_default_msize(void *p,void *pUser_data)

{
  size_t sVar1;
  
  if (p == (void *)0x0) {
    return 0;
  }
  sVar1 = malloc_usable_size();
  return sVar1;
}

Assistant:

static size_t crnd_default_msize(void* p, void* pUser_data) {
  (void)pUser_data;
#ifdef WIN32
  return p ? _msize(p) : 0;
#elif defined(__APPLE__)
  return p ? malloc_size(p) : 0;
#else
  return p ? malloc_usable_size(p) : 0;
#endif
}